

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O1

int LaplaceMatrix(sunrealtype c,SUNMatrix Jac,UserData udata)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  
  lVar3 = udata->N;
  if (2 < lVar3) {
    dVar1 = udata->dx;
    lVar2 = *(long *)((long)Jac->content + 0x28);
    lVar3 = lVar3 + -2;
    plVar4 = (long *)(*(long *)((long)Jac->content + 0x40) + 0x40);
    do {
      *(double *)(plVar4[-8] + 0x18 + lVar2 * 8) =
           (udata->du / dVar1) / dVar1 + *(double *)(plVar4[-8] + 0x18 + lVar2 * 8);
      *(double *)(plVar4[-7] + 0x18 + lVar2 * 8) =
           (udata->dv / dVar1) / dVar1 + *(double *)(plVar4[-7] + 0x18 + lVar2 * 8);
      *(double *)(plVar4[-6] + 0x18 + lVar2 * 8) =
           (udata->dw / dVar1) / dVar1 + *(double *)(plVar4[-6] + 0x18 + lVar2 * 8);
      *(double *)(plVar4[-5] + lVar2 * 8) =
           *(double *)(plVar4[-5] + lVar2 * 8) - ((udata->du + udata->du) / dVar1) / dVar1;
      *(double *)(plVar4[-4] + lVar2 * 8) =
           *(double *)(plVar4[-4] + lVar2 * 8) - ((udata->dv + udata->dv) / dVar1) / dVar1;
      *(double *)(plVar4[-3] + lVar2 * 8) =
           *(double *)(plVar4[-3] + lVar2 * 8) - ((udata->dw + udata->dw) / dVar1) / dVar1;
      *(double *)(plVar4[-2] + -0x18 + lVar2 * 8) =
           (udata->du / dVar1) / dVar1 + *(double *)(plVar4[-2] + -0x18 + lVar2 * 8);
      *(double *)(plVar4[-1] + -0x18 + lVar2 * 8) =
           (udata->dv / dVar1) / dVar1 + *(double *)(plVar4[-1] + -0x18 + lVar2 * 8);
      *(double *)(*plVar4 + -0x18 + lVar2 * 8) =
           (udata->dw / dVar1) / dVar1 + *(double *)(*plVar4 + -0x18 + lVar2 * 8);
      plVar4 = plVar4 + 3;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return (int)lVar3;
}

Assistant:

static int LaplaceMatrix(sunrealtype c, SUNMatrix Jac, UserData udata)
{
  sunindextype N = udata->N; /* set shortcuts */
  sunrealtype dx = udata->dx;
  sunindextype i;

  /* iterate over intervals, filling in Jacobian of (L*y) using SM_ELEMENT_B
     macro (see sunmatrix_band.h) */
  for (i = 1; i < N - 1; i++)
  {
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i - 1, 0)) += c * udata->du / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i - 1, 1)) += c * udata->dv / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i - 1, 2)) += c * udata->dw / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 0)) += -c * SUN_RCONST(2.0) *
                                               udata->du / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 1)) += -c * SUN_RCONST(2.0) *
                                               udata->dv / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i, 2)) += -c * SUN_RCONST(2.0) *
                                               udata->dw / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i + 1, 0)) += c * udata->du / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i + 1, 1)) += c * udata->dv / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i + 1, 2)) += c * udata->dw / dx / dx;
  }

  /* Return with success */
  return 0;
}